

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall
sptk::reaper::EpochTracker::GetSymmetryStats
          (EpochTracker *this,vector<float,_std::allocator<float>_> *data,float *pos_rms,
          float *neg_rms,float *mean)

{
  pointer pfVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  double dVar11;
  
  pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar4 = (ulong)((long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar1) >> 2;
  uVar7 = 0;
  iVar5 = (int)uVar4;
  uVar3 = 0;
  if (0 < iVar5) {
    uVar3 = uVar4 & 0xffffffff;
  }
  fVar2 = 0.0;
  for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    fVar2 = fVar2 + pfVar1[uVar7];
  }
  fVar2 = fVar2 / (float)iVar5;
  *mean = fVar2;
  dVar11 = 0.0;
  iVar6 = 0;
  iVar5 = 0;
  dVar8 = 0.0;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    fVar10 = pfVar1[uVar4] - fVar2;
    dVar9 = (double)fVar10 * (double)fVar10;
    if (fVar10 <= 0.0) {
      if (fVar10 < 0.0) {
        dVar11 = dVar11 + dVar9;
        iVar5 = iVar5 + 1;
      }
    }
    else {
      dVar8 = dVar8 + dVar9;
      iVar6 = iVar6 + 1;
    }
  }
  dVar8 = dVar8 / (double)iVar6;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  *pos_rms = (float)dVar8;
  dVar11 = dVar11 / (double)iVar5;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  *neg_rms = (float)dVar11;
  return;
}

Assistant:

void EpochTracker::GetSymmetryStats(const std::vector<float>& data, float* pos_rms,
                                    float* neg_rms, float* mean) {
  int32_t n_input = data.size();
  double p_sum = 0.0;
  double n_sum = 0.0;
  double sum = 0.0;
  int32_t n_p = 0;
  int32_t n_n = 0;
  for (int32_t i = 0; i < n_input; ++i) {
    sum += data[i];
  }
  *mean = sum / n_input;
  for (int32_t i = 0; i < n_input; ++i) {
    double val = data[i] - *mean;
    if (val > 0.0) {
      p_sum += (val * val);
      n_p++;
    } else {
      if (val < 0.0) {
        n_sum += (val * val);
        n_n++;
      }
    }
  }
  *pos_rms = sqrt(p_sum / n_p);
  *neg_rms = sqrt(n_sum / n_n);
}